

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_sockets.c
# Opt level: O0

int mbedtls_net_send(void *ctx,uchar *buf,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int fd;
  int ret;
  size_t len_local;
  uchar *buf_local;
  void *ctx_local;
  
  if (*ctx < 0) {
    ctx_local._4_4_ = -0x45;
  }
  else {
    sVar2 = write(*ctx,buf,len);
    ctx_local._4_4_ = (int)sVar2;
    if (ctx_local._4_4_ < 0) {
      iVar1 = net_would_block((mbedtls_net_context *)ctx);
      if (iVar1 == 0) {
        piVar3 = __errno_location();
        if ((*piVar3 == 0x20) || (piVar3 = __errno_location(), *piVar3 == 0x68)) {
          ctx_local._4_4_ = -0x50;
        }
        else {
          piVar3 = __errno_location();
          if (*piVar3 == 4) {
            ctx_local._4_4_ = -0x6880;
          }
          else {
            ctx_local._4_4_ = -0x4e;
          }
        }
      }
      else {
        ctx_local._4_4_ = -0x6880;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_net_send( void *ctx, const unsigned char *buf, size_t len )
{
    int ret;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

    ret = (int) write( fd, buf, len );

    if( ret < 0 )
    {
        if( net_would_block( ctx ) != 0 )
            return( MBEDTLS_ERR_SSL_WANT_WRITE );

#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
        if( WSAGetLastError() == WSAECONNRESET )
            return( MBEDTLS_ERR_NET_CONN_RESET );
#else
        if( errno == EPIPE || errno == ECONNRESET )
            return( MBEDTLS_ERR_NET_CONN_RESET );

        if( errno == EINTR )
            return( MBEDTLS_ERR_SSL_WANT_WRITE );
#endif

        return( MBEDTLS_ERR_NET_SEND_FAILED );
    }

    return( ret );
}